

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O0

int bam_write1(BGZF *fp,bam1_t *b)

{
  int iVar1;
  void *data;
  ssize_t sVar2;
  bool bVar3;
  int local_64;
  int local_54;
  int ok;
  int i;
  uint32_t y;
  uint32_t block_len;
  uint32_t x [8];
  bam1_core_t *c;
  bam1_t *b_local;
  BGZF *fp_local;
  
  i = b->l_data + 0x20;
  y = (b->core).tid;
  block_len = (b->core).pos;
  x[0] = (int)*(undefined8 *)&(b->core).field_0x8 << 0x10 |
         ((uint)((ulong)*(undefined8 *)&(b->core).field_0x8 >> 0x10) & 0xff) << 8 |
         (uint)((ulong)*(undefined8 *)&(b->core).field_0x8 >> 0x18) & 0xff;
  x[1] = (int)((ulong)*(undefined8 *)&(b->core).field_0x8 >> 0x20) << 0x10 |
         (uint)(ushort)((ulong)*(undefined8 *)&(b->core).field_0x8 >> 0x30);
  x[2] = (b->core).l_qseq;
  x[3] = (b->core).mtid;
  x[4] = (b->core).mpos;
  x[5] = (b->core).isize;
  iVar1 = bgzf_flush_try(fp,(ulong)(b->l_data + 0x24));
  bVar3 = -1 < iVar1;
  if ((*(int *)fp << 0xc) >> 0x1e == 0) {
    if (bVar3) {
      sVar2 = bgzf_write(fp,&i,4);
      bVar3 = -1 < sVar2;
    }
  }
  else {
    for (local_54 = 0; local_54 < 8; local_54 = local_54 + 1) {
      ed_swap_4p(&y + local_54);
    }
    ok = i;
    if (bVar3) {
      data = ed_swap_4p(&ok);
      sVar2 = bgzf_write(fp,data,4);
      bVar3 = -1 < sVar2;
    }
    swap_data(&b->core,b->l_data,b->data,1);
  }
  if (bVar3) {
    sVar2 = bgzf_write(fp,&y,0x20);
    bVar3 = -1 < sVar2;
  }
  if (bVar3) {
    sVar2 = bgzf_write(fp,b->data,(long)b->l_data);
    bVar3 = -1 < sVar2;
  }
  if ((*(int *)fp << 0xc) >> 0x1e != 0) {
    swap_data(&b->core,b->l_data,b->data,0);
  }
  if (bVar3) {
    local_64 = i + 4;
  }
  else {
    local_64 = -1;
  }
  return local_64;
}

Assistant:

int bam_write1(BGZF *fp, const bam1_t *b)
{
    const bam1_core_t *c = &b->core;
    uint32_t x[8], block_len = b->l_data + 32, y;
    int i, ok;
    x[0] = c->tid;
    x[1] = c->pos;
    x[2] = (uint32_t)c->bin<<16 | c->qual<<8 | c->l_qname;
    x[3] = (uint32_t)c->flag<<16 | c->n_cigar;
    x[4] = c->l_qseq;
    x[5] = c->mtid;
    x[6] = c->mpos;
    x[7] = c->isize;
    ok = (bgzf_flush_try(fp, 4 + block_len) >= 0);
    if (fp->is_be) {
        for (i = 0; i < 8; ++i) ed_swap_4p(x + i);
        y = block_len;
        if (ok) ok = (bgzf_write(fp, ed_swap_4p(&y), 4) >= 0);
        swap_data(c, b->l_data, b->data, 1);
    } else {
        if (ok) ok = (bgzf_write(fp, &block_len, 4) >= 0);
    }
    if (ok) ok = (bgzf_write(fp, x, 32) >= 0);
    if (ok) ok = (bgzf_write(fp, b->data, b->l_data) >= 0);
    if (fp->is_be) swap_data(c, b->l_data, b->data, 0);
    return ok? 4 + block_len : -1;
}